

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QGraphicsItemCache * __thiscall
QGraphicsItemPrivate::maybeExtraItemCache(QGraphicsItemPrivate *this)

{
  long lVar1;
  QGraphicsItemCache *pQVar2;
  long in_FS_OFFSET;
  QVariant *v;
  undefined4 in_stack_ffffffffffffffe4;
  undefined8 in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  v = (QVariant *)&stack0xffffffffffffffd8;
  extra((QGraphicsItemPrivate *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  pQVar2 = (QGraphicsItemCache *)qvariant_cast<void*>(v);
  ::QVariant::~QVariant(v);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsItemCache *QGraphicsItemPrivate::maybeExtraItemCache() const
{
    return (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
}